

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O0

CellRelation
S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>(S2CellId target,Iterator *it)

{
  bool bVar1;
  bool local_82;
  bool local_81;
  S2CellId local_70;
  uint64 local_68;
  uint64 local_60;
  S2CellId local_58;
  uint64 local_50;
  S2CellId local_48;
  uint64 local_40;
  uint64 local_38;
  uint64 local_30;
  uint64 local_28;
  Iterator *local_20;
  Iterator *it_local;
  S2CellId target_local;
  
  local_20 = it;
  unique0x10000148 = target.id_;
  local_28 = (uint64)S2CellId::range_min((S2CellId *)((long)&it_local + 4));
  MutableS2ShapeIndex::Iterator::Seek(it,(S2CellId)local_28);
  bVar1 = done(&local_20->super_IteratorBase);
  if (!bVar1) {
    local_30 = (uint64)id(&local_20->super_IteratorBase);
    local_38 = stack0xffffffffffffffec;
    bVar1 = operator>=((S2CellId)local_30,stack0xffffffffffffffec);
    local_81 = false;
    if (bVar1) {
      local_48 = id(&local_20->super_IteratorBase);
      local_40 = (uint64)S2CellId::range_min(&local_48);
      local_50 = stack0xffffffffffffffec;
      local_81 = operator<=((S2CellId)local_40,stack0xffffffffffffffec);
    }
    if (local_81 != false) {
      return INDEXED;
    }
    local_58 = id(&local_20->super_IteratorBase);
    local_60 = (uint64)S2CellId::range_max((S2CellId *)((long)&it_local + 4));
    bVar1 = operator<=(local_58,(S2CellId)local_60);
    if (bVar1) {
      return SUBDIVIDED;
    }
  }
  bVar1 = MutableS2ShapeIndex::Iterator::Prev(local_20);
  local_82 = false;
  if (bVar1) {
    local_70 = id(&local_20->super_IteratorBase);
    local_68 = (uint64)S2CellId::range_max(&local_70);
    local_82 = operator>=((S2CellId)local_68,stack0xffffffffffffffec);
  }
  if (local_82 == false) {
    target_local.id_._0_4_ = DISJOINT;
  }
  else {
    target_local.id_._0_4_ = INDEXED;
  }
  return (CellRelation)target_local.id_;
}

Assistant:

inline S2ShapeIndex::CellRelation
S2ShapeIndex::IteratorBase::LocateImpl(S2CellId target, Iter* it) {
  // Let T be the target, let I = cell_map_->lower_bound(T.range_min()), and
  // let I' be the predecessor of I.  If T contains any index cells, then T
  // contains I.  Similarly, if T is contained by an index cell, then the
  // containing cell is either I or I'.  We test for containment by comparing
  // the ranges of leaf cells spanned by T, I, and I'.

  it->Seek(target.range_min());
  if (!it->done()) {
    if (it->id() >= target && it->id().range_min() <= target) return INDEXED;
    if (it->id() <= target.range_max()) return SUBDIVIDED;
  }
  if (it->Prev() && it->id().range_max() >= target) return INDEXED;
  return DISJOINT;
}